

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  u32 uVar1;
  byte bVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  DbPage *pOvflPage;
  DbPage *local_50;
  uint local_44;
  u32 local_40;
  int local_3c;
  ulong local_38;
  
  local_3c = pCheck->nErr;
  local_40 = N;
  do {
    if ((iPage == 0) || (pCheck->mxErr == 0)) break;
    iVar5 = checkRef(pCheck,iPage);
    if (iVar5 == 0) {
      uVar1 = N - 1;
      iVar5 = (*pCheck->pPager->xGet)(pCheck->pPager,iPage,&local_50,0);
      if (iVar5 == 0) {
        puVar3 = (uint *)local_50->pData;
        if (isFreeList == 0) {
          N = uVar1;
          if ((pCheck->pBt->autoVacuum != '\0') && (uVar1 != 0)) {
            uVar9 = *puVar3;
            checkPtrmap(pCheck,uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                               uVar9 << 0x18,'\x04',iPage);
          }
        }
        else {
          uVar9 = puVar3[1];
          uVar10 = (uint)*(byte *)((long)puVar3 + 5);
          bVar2 = *(byte *)((long)puVar3 + 6);
          uVar6 = (uint)*(byte *)((long)puVar3 + 7);
          if (pCheck->pBt->autoVacuum != '\0') {
            local_44 = (uint)*(byte *)((long)puVar3 + 7);
            local_38 = (ulong)*(byte *)((long)puVar3 + 5);
            checkPtrmap(pCheck,iPage,'\x02',0);
            uVar10 = (uint)local_38;
            uVar6 = local_44;
          }
          iVar5 = (uint)(byte)uVar9 * 0x1000000;
          uVar9 = (uint)bVar2 * 0x100;
          uVar12 = uVar10 * 0x10000 + iVar5 | uVar9 | uVar6;
          if ((pCheck->pBt->usableSize >> 2) - 2 < uVar12) {
            checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)iPage);
            N = N - 2;
          }
          else {
            if (0 < (int)uVar12) {
              uVar8 = 0;
              do {
                uVar11 = puVar3[uVar8 + 2];
                uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18;
                if (pCheck->pBt->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar11,'\x02',0);
                }
                checkRef(pCheck,uVar11);
                uVar8 = uVar8 + 1;
              } while (uVar9 + uVar6 + iVar5 + uVar10 * 0x10000 != uVar8);
            }
            N = uVar1 - uVar12;
          }
        }
        uVar9 = *puVar3;
        iPage = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        bVar4 = true;
        if (local_50 != (DbPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_50);
        }
      }
      else {
        bVar4 = false;
        checkAppendMsg(pCheck,"failed to get page %d",(ulong)iPage);
        N = uVar1;
      }
    }
    else {
      bVar4 = false;
    }
  } while (bVar4);
  if ((N != 0) && (local_3c == pCheck->nErr)) {
    pcVar7 = "size";
    if (isFreeList == 0) {
      pcVar7 = "overflow list length";
    }
    checkAppendMsg(pCheck,"%s is %d but should be %d",pcVar7,(ulong)(local_40 - N));
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %d but should be %d",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}